

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::parse(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte __c;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Cell CVar5;
  Cell CVar6;
  size_t sVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  requireDStackDepth(this,1,"PARSE");
  requireDStackAvailable(this,1,"PARSE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar8 = false;
  do {
    while (iVar3 = getSourceBufferRemain(this), iVar3 == 0 && (uVar2 & 0xff) == 0x29) {
      bVar1 = refillNextLine(this);
      bVar8 = (bool)(!bVar1 | bVar8);
    }
    iVar4 = getSourceBufferRemain(this);
    if (0 < iVar4) {
      CVar5 = getSourceAddress(this);
      CVar6 = getSourceBufferOffset(this);
      __c = dataSpaceAt(this,CVar6 + CVar5);
      incSourceBufferOffset(this);
      if ((((uVar2 & 0xff) == 0x20) && (iVar4 = isspace((uint)__c), iVar4 != 0)) ||
         ((int)(char)uVar2 == (uint)__c)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_50,__c);
    }
    bVar1 = !bVar8;
    bVar8 = false;
  } while (iVar3 != 0 && bVar1);
  sVar7 = PutStringToEndOfDataSpace(this,&local_50);
  ForthStack<unsigned_int>::setTop(this_00,(uint)sVar7);
  ForthStack<unsigned_int>::push(this_00,(uint)local_50._M_string_length);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void parse() {
			REQUIRE_DSTACK_DEPTH(1, "PARSE");
			REQUIRE_DSTACK_AVAILABLE(1, "PARSE");

			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `PARSE` word.  Unlike `WORD`,
			this is a "normal" string and I won't need to store the count at the beginning
			of this buffer.

			****/

			std::string parseBuffer{};
			parseBuffer.clear();
			// Copy characters until we see the delimiter.

			bool exits{ false };
			while (!exits){
				while (getSourceBufferRemain()==0){ 
					// load next string from input buffer
					if (delim == ')') {
						auto flag=refillNextLine();
						if (!flag) {
							exits = true;							
						}
					}
					else {
						exits = true;
						break;
					}
				}
				if (getSourceBufferRemain() > 0) {
					// next char
					auto ch = getDataChar(getSourceAddress() + getSourceBufferOffset());
					incSourceBufferOffset();
					if ((delim == ' ' && isspace(static_cast<unsigned char>(ch))) || (delim == ch)) {
						exits = true;
					}
					else {
						parseBuffer.push_back(ch);
					}
				}
			}
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(parseBuffer);

			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(parseBuffer.size()));
		}